

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

bool __thiscall
CodeGenGenericContext::IsLastRegVmRegisterUse
          (CodeGenGenericContext *this,uchar regId,uchar *instRegKillInfo)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  uchar *puVar7;
  uchar *puVar8;
  uint uVar9;
  bool bVar10;
  
  bVar1 = *instRegKillInfo;
  if (bVar1 != 0) {
    bVar10 = bVar1 >= 0x10;
    if (bVar1 < 0x10) {
      puVar7 = instRegKillInfo + 1;
    }
    else {
      puVar7 = instRegKillInfo + 2;
      if (instRegKillInfo[1] != regId) {
        uVar5 = (uint)(bVar1 >> 4);
        puVar8 = puVar7;
        uVar3 = 1;
        do {
          uVar9 = uVar3;
          puVar7 = instRegKillInfo + (ulong)(uVar5 - 1) + 2;
          if (uVar5 == uVar9) break;
          puVar7 = puVar8 + 1;
          uVar2 = *puVar8;
          puVar8 = puVar7;
          uVar3 = uVar9 + 1;
        } while (uVar2 != regId);
        bVar10 = uVar9 < uVar5;
      }
    }
    bVar4 = false;
    if (bVar10) {
      bVar10 = false;
LAB_001cf9d6:
      bVar4 = true;
    }
    else if ((bVar1 & 0xf) == 0) {
      bVar10 = true;
    }
    else {
      lVar6 = 0;
      do {
        bVar10 = puVar7[lVar6] != regId;
        if (puVar7[lVar6] == regId) goto LAB_001cf9d6;
        lVar6 = lVar6 + 1;
      } while ((bVar1 & 0xf) != (uint)lVar6);
      bVar4 = false;
    }
    if (!bVar10) {
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool CodeGenGenericContext::IsLastRegVmRegisterUse(unsigned char regId, unsigned char *instRegKillInfo)
{
	if(unsigned regKillCounts = *instRegKillInfo)
	{
		instRegKillInfo++;

		unsigned preKillCount = (regKillCounts >> 4);
		unsigned postKillCount = (regKillCounts & 0xf);

		for(unsigned k = 0; k < preKillCount; k++)
		{
			if(regId == *instRegKillInfo++)
				return true;
		}

		for(unsigned k = 0; k < postKillCount; k++)
		{
			if(regId == *instRegKillInfo++)
				return true;
		}
	}

	return false;
}